

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int reinstall_initial_encryption(quicly_conn_t *conn,int err_code_if_unknown_version)

{
  st_ptls_salt_t *egress;
  int in_ESI;
  ptls_cipher_suite_t *in_RDI;
  ptls_iovec_t pVar1;
  size_t unaff_retaddr;
  undefined1 in_stack_00000010 [16];
  quicly_conn_t *in_stack_00000020;
  st_ptls_salt_t *salt;
  quicly_context_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  egress = get_salt(*(uint32_t *)&in_RDI[0x28].hash);
  if (egress != (st_ptls_salt_t *)0x0) {
    dispose_cipher((st_quicly_cipher_context_t *)0x13d7fa);
    dispose_cipher((st_quicly_cipher_context_t *)0x13d813);
    get_aes128gcmsha256(in_stack_ffffffffffffff90);
    pVar1 = ptls_iovec_init(&in_RDI[0xb].name,(ulong)*(byte *)((long)&in_RDI[0xc].aead + 4));
    pVar1.len._4_4_ = pVar1.len._4_4_;
    ptls_iovec_init(egress,0x14);
    pVar1.base._4_4_ = in_stack_fffffffffffffffc;
    pVar1.base._0_4_ = in_stack_fffffffffffffff8;
    pVar1.len = unaff_retaddr;
    in_ESI = setup_initial_encryption
                       (in_RDI,(st_quicly_cipher_context_t *)
                               CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                        (st_quicly_cipher_context_t *)egress,pVar1,pVar1.len._4_4_,
                        (ptls_iovec_t)in_stack_00000010,in_stack_00000020);
  }
  return in_ESI;
}

Assistant:

static int reinstall_initial_encryption(quicly_conn_t *conn, int err_code_if_unknown_version)
{
    const struct st_ptls_salt_t *salt;

    /* get salt */
    if ((salt = get_salt(conn->super.version)) == NULL)
        return err_code_if_unknown_version;

    /* dispose existing context */
    dispose_cipher(&conn->initial->cipher.ingress);
    dispose_cipher(&conn->initial->cipher.egress);

    /* setup encryption context */
    return setup_initial_encryption(
        get_aes128gcmsha256(conn->super.ctx), &conn->initial->cipher.ingress, &conn->initial->cipher.egress,
        ptls_iovec_init(conn->super.remote.cid_set.cids[0].cid.cid, conn->super.remote.cid_set.cids[0].cid.len), 1,
        ptls_iovec_init(salt->initial, sizeof(salt->initial)), NULL);
}